

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O0

void __thiscall
TPZGeoElRefLess<pzgeom::TPZQuadraticTetra>::AllHigherDimensionSides
          (TPZGeoElRefLess<pzgeom::TPZQuadraticTetra> *this,int side,int targetdimension,
          TPZStack<TPZGeoElSide,_10> *elsides)

{
  int iVar1;
  int64_t iVar2;
  int *piVar3;
  TPZGeoElSide *this_00;
  TPZGeoEl *in_RCX;
  int in_EDX;
  long *in_RDI;
  int size;
  int i;
  TPZStack<int,_10> highsides;
  TPZStack<int,_10> *in_stack_ffffffffffffff28;
  undefined8 in_stack_ffffffffffffff30;
  TPZGeoEl *gel;
  TPZStack<int,_10> *in_stack_ffffffffffffff40;
  undefined1 local_90 [28];
  int local_74;
  int local_70;
  TPZVec<int> local_60 [2];
  TPZGeoEl *local_18;
  int local_10;
  
  iVar1 = (int)((ulong)in_stack_ffffffffffffff30 >> 0x20);
  local_18 = in_RCX;
  local_10 = in_EDX;
  TPZStack<int,_10>::TPZStack(in_stack_ffffffffffffff40);
  pztopology::TPZTetrahedron::HigherDimensionSides(iVar1,in_stack_ffffffffffffff28);
  iVar2 = TPZVec<int>::NElements(local_60);
  local_74 = (int)iVar2;
  for (local_70 = 0; local_70 < local_74; local_70 = local_70 + 1) {
    piVar3 = TPZVec<int>::operator[](local_60,(long)local_70);
    iVar1 = (**(code **)(*in_RDI + 0x208))(in_RDI,*piVar3);
    if (iVar1 == local_10) {
      gel = local_18;
      this_00 = (TPZGeoElSide *)TPZVec<int>::operator[](local_60,(long)local_70);
      TPZGeoElSide::TPZGeoElSide(this_00,gel,(int)((ulong)local_90 >> 0x20));
      TPZStack<TPZGeoElSide,_10>::Push((TPZStack<TPZGeoElSide,_10> *)this_00,(TPZGeoElSide *)gel);
      TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1813182);
    }
  }
  TPZStack<int,_10>::~TPZStack((TPZStack<int,_10> *)0x18131ca);
  return;
}

Assistant:

void
TPZGeoElRefLess<TGeo>::AllHigherDimensionSides(int side,int targetdimension,TPZStack<TPZGeoElSide> &elsides){
	TPZStack<int> highsides;
	TGeo::HigherDimensionSides(side,highsides);
	int i,size = highsides.NElements();
	for(i=0;i<size;i++) {
		if(SideDimension(highsides[i]) == targetdimension) {
			elsides.Push(TPZGeoElSide(this,highsides[i]));
		}
	}
}